

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O0

void duckdb::AggregateExecutor::
     Finalize<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>,duckdb::date_t,duckdb::ArgMinMaxBase<duckdb::GreaterThan,true>>
               (Vector *states,AggregateInputData *aggr_input_data,Vector *result,idx_t count,
               idx_t offset)

{
  VectorType VVar1;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *in_RCX;
  Vector *in_RDX;
  AggregateInputData *in_RSI;
  Vector *in_RDI;
  long in_R8;
  idx_t i;
  AggregateFinalizeData finalize_data_1;
  date_t *rdata_1;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> **sdata_1;
  AggregateFinalizeData finalize_data;
  date_t *rdata;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> **sdata;
  date_t *in_stack_ffffffffffffff78;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *in_stack_ffffffffffffff80;
  ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *state;
  AggregateFinalizeData local_78;
  date_t *local_60;
  undefined8 in_stack_ffffffffffffffa8;
  VectorType vector_type_p;
  Vector *in_stack_ffffffffffffffb0;
  
  vector_type_p = (VectorType)((ulong)in_stack_ffffffffffffffa8 >> 0x38);
  VVar1 = Vector::GetVectorType(in_RDI);
  if (VVar1 == CONSTANT_VECTOR) {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    ConstantVector::GetData<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>*>
              ((Vector *)0x1bd9ec0);
    ConstantVector::GetData<duckdb::date_t>((Vector *)0x1bd9ecf);
    AggregateFinalizeData::AggregateFinalizeData
              ((AggregateFinalizeData *)&stack0xffffffffffffffb0,in_RDX,in_RSI);
    ArgMinMaxBase<duckdb::GreaterThan,true>::
    Finalize<duckdb::date_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>
              (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
               (AggregateFinalizeData *)0x1bd9eff);
  }
  else {
    Vector::SetVectorType(in_stack_ffffffffffffffb0,vector_type_p);
    FlatVector::GetData<duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>*>
              ((Vector *)0x1bd9f1d);
    local_60 = FlatVector::GetData<duckdb::date_t>((Vector *)0x1bd9f2c);
    AggregateFinalizeData::AggregateFinalizeData(&local_78,in_RDX,in_RSI);
    for (state = (ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *)0x0; state < in_RCX;
        state = (ArgMinMaxState<duckdb::date_t,_duckdb::string_t> *)
                &(state->super_ArgMinMaxStateBase).arg_null) {
      local_78.result_idx = (idx_t)(&(state->super_ArgMinMaxStateBase).is_initialized + in_R8);
      ArgMinMaxBase<duckdb::GreaterThan,true>::
      Finalize<duckdb::date_t,duckdb::ArgMinMaxState<duckdb::date_t,duckdb::string_t>>
                (state,in_stack_ffffffffffffff78,(AggregateFinalizeData *)0x1bd9f92);
    }
  }
  return;
}

Assistant:

static void Finalize(Vector &states, AggregateInputData &aggr_input_data, Vector &result, idx_t count,
	                     idx_t offset) {
		if (states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			result.SetVectorType(VectorType::CONSTANT_VECTOR);

			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			auto rdata = ConstantVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			OP::template Finalize<RESULT_TYPE, STATE_TYPE>(**sdata, *rdata, finalize_data);
		} else {
			D_ASSERT(states.GetVectorType() == VectorType::FLAT_VECTOR);
			result.SetVectorType(VectorType::FLAT_VECTOR);

			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			auto rdata = FlatVector::GetData<RESULT_TYPE>(result);
			AggregateFinalizeData finalize_data(result, aggr_input_data);
			for (idx_t i = 0; i < count; i++) {
				finalize_data.result_idx = i + offset;
				OP::template Finalize<RESULT_TYPE, STATE_TYPE>(*sdata[i], rdata[finalize_data.result_idx],
				                                               finalize_data);
			}
		}
	}